

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O3

DEVICE_MESSAGE_DISPOSITION_INFO *
amqp_device_clone_message_disposition_info(DEVICE_MESSAGE_DISPOSITION_INFO *disposition_info)

{
  int iVar1;
  DEVICE_MESSAGE_DISPOSITION_INFO *__ptr;
  LOGGER_LOG p_Var2;
  
  __ptr = (DEVICE_MESSAGE_DISPOSITION_INFO *)calloc(1,0x10);
  if (__ptr == (DEVICE_MESSAGE_DISPOSITION_INFO *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_clone_message_disposition_info",0x68b,1,
                "Failed cloning DEVICE_MESSAGE_DISPOSITION_INFO");
      return (DEVICE_MESSAGE_DISPOSITION_INFO *)0x0;
    }
  }
  else {
    iVar1 = mallocAndStrcpy_s(&__ptr->source,disposition_info->source);
    if (iVar1 == 0) {
      __ptr->message_id = disposition_info->message_id;
      return __ptr;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_clone_message_disposition_info",0x68f,1,
                "Failed cloning DEVICE_MESSAGE_DISPOSITION_INFO->source");
    }
    free(__ptr);
  }
  return (DEVICE_MESSAGE_DISPOSITION_INFO *)0x0;
}

Assistant:

DEVICE_MESSAGE_DISPOSITION_INFO* amqp_device_clone_message_disposition_info(DEVICE_MESSAGE_DISPOSITION_INFO* disposition_info)
{
    DEVICE_MESSAGE_DISPOSITION_INFO* clone;

    if ((clone = calloc(1, sizeof(DEVICE_MESSAGE_DISPOSITION_INFO))) == NULL)
    {
        LogError("Failed cloning DEVICE_MESSAGE_DISPOSITION_INFO");
    }
    else if (mallocAndStrcpy_s(&clone->source, disposition_info->source) != 0)
    {
        LogError("Failed cloning DEVICE_MESSAGE_DISPOSITION_INFO->source");
        free(clone);
        clone = NULL;
    }
    else
    {
        clone->message_id = disposition_info->message_id;
    }

    return clone;
}